

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-server.c
# Opt level: O1

void ssh1sesschan_send_exit_status(SshChannel *sc,int status)

{
  long lVar1;
  
  lVar1 = (*(code *)((sc[0xd].cl)->logctx->queue).tail)(0x14);
  BinarySink_put_uint32((BinarySink *)(lVar1 + 0x60),(long)status);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,(PacketQueueNode *)(lVar1 + 0x40));
  *(undefined1 *)((long)&sc[8].cl + 1) = 1;
  return;
}

Assistant:

static void ssh1sesschan_send_exit_status(SshChannel *sc, int status)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_EXIT_STATUS);
    put_uint32(pktout, status);
    pq_push(s->ppl.out_pq, pktout);

    s->sent_exit_status = true;
}